

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::LogBuilder::convertToColoredOutput(LogBuilder *this,string_t *logLine,Level level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->m_termSupportsColor != true) {
    return;
  }
  if (level == Trace) {
    std::operator+(&local_50,"\x1b[35m",logLine);
    std::operator+(&local_30,&local_50,"\x1b[0m");
  }
  else if (level == Debug) {
    std::operator+(&local_50,"\x1b[32m",logLine);
    std::operator+(&local_30,&local_50,"\x1b[0m");
  }
  else {
    if (level != Fatal) {
      if (level == Info) {
        std::operator+(&local_50,"\x1b[36m",logLine);
        std::operator+(&local_30,&local_50,"\x1b[0m");
        goto LAB_0016e950;
      }
      if (level == Warning) {
        std::operator+(&local_50,"\x1b[33m",logLine);
        std::operator+(&local_30,&local_50,"\x1b[0m");
        goto LAB_0016e950;
      }
      if (level != Error) {
        return;
      }
    }
    std::operator+(&local_50,"\x1b[31m",logLine);
    std::operator+(&local_30,&local_50,"\x1b[0m");
  }
LAB_0016e950:
  std::__cxx11::string::operator=((string *)logLine,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void LogBuilder::convertToColoredOutput(base::type::string_t* logLine, Level level) {
  if (!m_termSupportsColor) return;
  const base::type::char_t* resetColor = ELPP_LITERAL("\x1b[0m");
  if (level == Level::Error || level == Level::Fatal)
    *logLine = ELPP_LITERAL("\x1b[31m") + *logLine + resetColor;
  else if (level == Level::Warning)
    *logLine = ELPP_LITERAL("\x1b[33m") + *logLine + resetColor;
  else if (level == Level::Debug)
    *logLine = ELPP_LITERAL("\x1b[32m") + *logLine + resetColor;
  else if (level == Level::Info)
    *logLine = ELPP_LITERAL("\x1b[36m") + *logLine + resetColor;
  else if (level == Level::Trace)
    *logLine = ELPP_LITERAL("\x1b[35m") + *logLine + resetColor;
}